

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O0

O3DGCErrorCode o3dgc::LoadBinData(Vector<long> *data,BinaryStream *bstream,unsigned_long *iterator)

{
  byte bVar1;
  ulong local_48;
  ulong local_40;
  unsigned_long h;
  unsigned_long i;
  long symbol;
  unsigned_long size;
  unsigned_long *iterator_local;
  BinaryStream *bstream_local;
  Vector<long> *data_local;
  
  size = (unsigned_long)iterator;
  iterator_local = (unsigned_long *)bstream;
  bstream_local = (BinaryStream *)data;
  BinaryStream::ReadUInt32ASCII(bstream,iterator);
  symbol = BinaryStream::ReadUInt32ASCII((BinaryStream *)iterator_local,(unsigned_long *)size);
  Vector<long>::Allocate((Vector<long> *)bstream_local,symbol * 7);
  Vector<long>::Clear((Vector<long> *)bstream_local);
  h = 0;
  while (h < (ulong)symbol) {
    bVar1 = BinaryStream::ReadUCharASCII((BinaryStream *)iterator_local,(unsigned_long *)size);
    i = (unsigned_long)bVar1;
    for (local_40 = 0; local_40 < 7; local_40 = local_40 + 1) {
      local_48 = i & 1;
      Vector<long>::PushBack((Vector<long> *)bstream_local,(long *)&local_48);
      i = (long)i >> 1;
      h = h + 1;
    }
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    LoadBinData(Vector<long> & data,
                                  const BinaryStream & bstream,
                                  unsigned long & iterator) 
    {
        bstream.ReadUInt32ASCII(iterator);
        const unsigned long size = bstream.ReadUInt32ASCII(iterator);
        long symbol;
        data.Allocate(size * O3DGC_BINARY_STREAM_BITS_PER_SYMBOL0);
        data.Clear();
        for(unsigned long i = 0; i < size;)
        {
            symbol = bstream.ReadUCharASCII(iterator);
            for(unsigned long h = 0; h < O3DGC_BINARY_STREAM_BITS_PER_SYMBOL0; ++h)
            {
                data.PushBack(symbol & 1);
                symbol >>= 1;
                ++i;
            }
        }
        return O3DGC_OK;
    }